

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O0

void GetOperand(char *oper,OpConfig *op,int pcconv)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  byte *pbVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  long templong;
  byte local_148;
  byte local_147;
  char local_146;
  int rloc;
  char tempop [128];
  char UCoper [128];
  char *opend;
  byte *pbStack_30;
  int i;
  char *t;
  char *s;
  int pcconv_local;
  OpConfig *op_local;
  char *oper_local;
  
  op->Defn = 0;
  op->Value = 0;
  op->Mode = 0;
  op->X = 0;
  op->Hunk = 0x7fff;
  op->Single = 0;
  if (*oper != '\0') {
    pbStack_30 = (byte *)(tempop + 0x78);
    for (t = oper; pcVar8 = t, *t != '\0'; t = t + 1) {
      *pbStack_30 = *t & 0xdf;
      pbStack_30 = pbStack_30 + 1;
    }
    *pbStack_30 = 0;
    pbVar5 = (byte *)(t + -1);
    if (*oper == '#') {
      t = oper + 1;
      if (*t == '~') {
        t = oper + 2;
      }
      lVar6 = GetValue(t,op->Loc + 1);
      op->Value = lVar6;
      op->Mode = 0xc;
      op->Hunk = Hunk2;
      op->Defn = DefLine2;
      op->Single = SingleFlag;
      if (oper[1] == '~') {
        if (Hunk2 != 0x7fff) {
          Error(op->Loc + 2,0xc);
          op->Hunk = 0x7fff;
        }
        op->Value = op->Value ^ 0xffffffffffffffff;
        if (Size == 1) {
          op->Value = op->Value & 0xff;
        }
        else if (Size == 2) {
          op->Value = op->Value & 0xffff;
        }
      }
    }
    else {
      iVar1 = (int)oper;
      iVar4 = (int)pbVar5;
      uVar3 = IsRegister(oper,(iVar4 - iVar1) + 1);
      if ((int)uVar3 < 0) {
        if (uVar3 == 0xfffffffe) {
          op->Mode = 0xd;
          op->Value = Sym->Val;
        }
        else {
          if ((*oper == '(') && (*pbVar5 == 0x29)) {
            iVar4 = IsRegister(oper + 1,(iVar4 - iVar1) + -1);
            if ((7 < iVar4) && (iVar4 < 0x10)) {
              op->Mode = 3;
              op->Rn = iVar4 + -8;
              return;
            }
            if (iVar4 != -1) {
              Error(op->Loc,8);
              return;
            }
          }
          else {
            if ((*oper == '(') && ((*pbVar5 == 0x2b && (t[-2] == ')')))) {
              op->Mode = 4;
              iVar4 = GetAReg(oper + 1,(iVar4 - iVar1) + -2,op->Loc + 1);
              op->Rn = iVar4;
              return;
            }
            if (((*oper == '-') && (*pbVar5 == 0x29)) && (oper[1] == '(')) {
              iVar4 = IsRegister(oper + 2,(iVar4 - iVar1) + -2);
              if ((7 < iVar4) && (iVar4 < 0x10)) {
                op->Mode = 5;
                op->Rn = iVar4 + -8;
                return;
              }
              if (0 < iVar4) {
                Error(op->Loc,8);
                return;
              }
            }
            else {
              iVar4 = strcmp(tempop + 0x78,"SR");
              if (iVar4 == 0) {
                op->Mode = 0xe;
                return;
              }
              iVar4 = strcmp(tempop + 0x78,"CCR");
              if (iVar4 == 0) {
                op->Mode = 0xf;
                return;
              }
              iVar4 = strcmp(tempop + 0x78,"USP");
              if (iVar4 == 0) {
                op->Mode = 0x10;
                return;
              }
            }
          }
          t = (char *)pbVar5;
          if (*pbVar5 == 0x29) {
            do {
              pcVar10 = t + -1;
              pcVar7 = t + -1;
              t = pcVar10;
              if (*pcVar7 == '(') break;
            } while (oper < pcVar10);
          }
          bVar2 = oper < t && *pbVar5 == 0x29;
          if (bVar2) {
            if (t == oper + 1) {
              bVar2 = *oper != '-' && bVar2;
            }
            else {
              pcVar7 = t + -1;
              if (*pcVar7 == '*') {
                iVar4 = IsOperator(t + -2);
                if ((iVar4 == 0) || (t[-2] == ')')) {
                  bVar2 = false;
                }
              }
              else {
                iVar4 = IsOperator(pcVar7);
                if ((iVar4 != 0) && (*pcVar7 != ')')) {
                  bVar2 = false;
                }
              }
            }
          }
          if (bVar2) {
            *t = '\0';
            lVar6 = GetValue(oper,op->Loc);
            op->Value = lVar6;
            op->Hunk = Hunk2;
            op->Defn = DefLine2;
            *t = '(';
            templong._4_4_ = ((int)(t + 1) + op->Loc) - iVar1;
            pcVar8 = GetField(t + 1,(char *)&local_148);
            if (*pcVar8 == '\0') {
              sVar9 = strlen((char *)&local_148);
              *(undefined1 *)((long)&templong + sVar9 + 7) = 0;
            }
            if (((local_146 == '\0') && ((local_148 & 0xdf) == 0x50)) &&
               ((local_147 & 0xdf) == 0x43)) {
              op->Mode = 10;
              if (op->Hunk == CurrHunk) {
                op->Value = op->Value - (AddrCnt + pcconv);
                op->Hunk = 0x7fff;
              }
            }
            else {
              if (((op->Value == 0) && (op->Hunk == 0x7fff)) &&
                 ((op->Defn < LineCount && (((AdrModeA & 0x4000U) == 0 && (NoOpt == 0)))))) {
                op->Mode = 3;
              }
              else {
                op->Mode = 6;
              }
              sVar9 = strlen((char *)&local_148);
              iVar4 = GetAReg((char *)&local_148,(int)sVar9,templong._4_4_);
              op->Rn = iVar4;
            }
            if (*pcVar8 != '\0') {
              if (op->Mode == 10) {
                op->Mode = 0xb;
              }
              else {
                op->Mode = 7;
              }
              if (*pcVar8 != ',') {
                Error(op->Loc,8);
              }
              templong._4_4_ = ((int)(pcVar8 + 1) + op->Loc) - iVar1;
              pcVar8 = GetField(pcVar8 + 1,(char *)&local_148);
              pbStack_30 = &local_148;
              sVar9 = strlen((char *)&local_148);
              if (*pcVar8 == '\0') {
                pbStack_30 = (byte *)((long)&templong + 7);
                *(undefined1 *)((long)&templong + sVar9 + 7) = 0;
              }
              else {
                Error(templong._4_4_,8);
              }
              pbVar5 = pbStack_30 + (sVar9 - 2);
              if ((pbVar5 < &local_148) || (*pbVar5 != 0x2e)) {
                op->Xsize = 2;
                pbStack_30 = pbStack_30 + sVar9 + 1;
              }
              else {
                pbStack_30 = pbStack_30 + (sVar9 - 1);
                *pbVar5 = 0;
                if ((*pbStack_30 & 0xdf) == 0x4c) {
                  op->Xsize = 4;
                }
                else if ((*pbStack_30 & 0xdf) == 0x57) {
                  op->Xsize = 2;
                }
                else {
                  Error(((int)pcVar8 + op->Loc + -1) - iVar1,9);
                  op->Xsize = 2;
                }
              }
              uVar3 = IsRegister((char *)&local_148,((int)pbStack_30 - (int)&local_148) + -1);
              op->Xn = uVar3 & 7;
              if (((int)uVar3 < 0) || (7 < (int)uVar3)) {
                if (((int)uVar3 < 8) || (0xf < (int)uVar3)) {
                  Error(templong._4_4_,8);
                }
                else {
                  op->X = 2;
                }
              }
              else {
                op->X = 1;
              }
            }
            if ((-1 < op->Hunk) && (op->Hunk != 0x7fff)) {
              Error(op->Loc,0xc);
            }
          }
          else {
            iVar4 = GetMultReg(oper,op->Loc);
            if (iVar4 == 0) {
              if ((((*oper == '(') && (pcVar8[-3] == ')')) && (pcVar8[-2] == '.')) &&
                 (((*pbVar5 & 0xdf) == 0x57 || ((*pbVar5 & 0xdf) == 0x4c)))) {
                pcVar8[-2] = '\0';
                lVar6 = GetValue(oper,op->Loc);
                op->Value = lVar6;
                op->Hunk = Hunk2;
                op->Defn = DefLine2;
                op->Single = SingleFlag;
                if ((*pbVar5 & 0xdf) == 0x57) {
                  op->Mode = 8;
                }
                else {
                  op->Mode = 9;
                }
                pcVar8[-2] = '.';
              }
              else {
                lVar6 = GetValue(oper,op->Loc);
                op->Value = lVar6;
                op->Hunk = Hunk2;
                op->Defn = DefLine2;
                op->Single = SingleFlag;
                op->Mode = 9;
                if (NoOpt == 0) {
                  if (DefLine2 < LineCount) {
                    if (-1 < Hunk2) {
                      if (Hunk2 == CurrHunk) {
                        if (((pcconv != 0) &&
                            (lVar6 = op->Value - (AddrCnt + pcconv), -0x8001 < lVar6)) &&
                           (lVar6 < 0x8000)) {
                          op->Mode = 10;
                          op->Value = lVar6;
                          op->Hunk = 0x7fff;
                        }
                      }
                      else if (Hunk2 == 0x7fff) {
                        if ((-0x8001 < op->Value) && (op->Value < 0x8000)) {
                          op->Mode = 8;
                        }
                      }
                      else if (((SmallData != -1) && (-1 < op->Value)) && (op->Value < 0x10000)) {
                        op->Mode = 6;
                        op->Rn = SmallData;
                        op->Value = op->Value - DataOffset;
                        op->Hunk = 0x7fff;
                      }
                    }
                  }
                  else if ((SmallData != -1) && ((AdrModeA & 0x20U) == 0)) {
                    if (Pass2 == 0) {
                      op->Mode = 6;
                      op->Rn = SmallData;
                      op->Hunk = 0x7fff;
                    }
                    else if (Hunk2 < 0) {
                      Error(op->Loc,0xe);
                      op->Mode = 8;
                    }
                    else if (Hunk2 == CurrHunk) {
                      op->Mode = 10;
                      op->Value = op->Value - (AddrCnt + pcconv);
                      op->Hunk = 0x7fff;
                      if (((pcconv == 0) || (op->Value < -0x8000)) || (0x7fff < op->Value)) {
                        Error(op->Loc,0xe);
                      }
                    }
                    else if (Hunk2 == 0x7fff) {
                      op->Mode = 8;
                      if ((op->Value < -0x8000) || (0x7fff < op->Value)) {
                        Error(op->Loc,0xe);
                      }
                    }
                    else {
                      op->Mode = 6;
                      op->Rn = SmallData;
                      op->Value = op->Value - DataOffset;
                      if ((op->Value < -0x8000) || (0x7fff < op->Value)) {
                        Error(op->Loc,0xe);
                      }
                    }
                  }
                }
              }
            }
            else {
              op->Value = (long)iVar4;
              op->Mode = 0xd;
            }
          }
        }
      }
      else {
        iVar4 = 1;
        if ((uVar3 & 8) != 0) {
          iVar4 = 2;
        }
        op->Mode = iVar4;
        op->Rn = uVar3 & 7;
      }
    }
  }
  return;
}

Assistant:

void 
GetOperand (char *oper, register struct OpConfig *op, int pcconv)
/* Finds mode and value for source or destination operand.
 If PC-relative addressing is permitted, "pcconv" gives the
 offset to the displacement word; otherwise "pcconv" is zero. */
{
	register char *s, *t;
	register int i;
	char *opend;
	char UCoper[MAXLINE], tempop[MAXLINE];
	int rloc;
	long templong;

	op->Value = op->Defn = 0;
	op->Mode = Null;
	op->X = X0;
	op->Hunk = ABSHUNK;
	op->Single = FALSE;

	if (*oper == '\0')
		return; /* There is nothing to process. */

	s = oper;
	t = UCoper;
	while (*s) {
#ifdef FASTTOUPPER
		*t++ = *s & (~ (1<<5)); /* Upper-case version */
#else
		*t++ = toupper(*s); /* Upper-case version */
#endif
		s++;
	}
	*t = '\0';
	opend = s - 1; /* Last character of operand */

	if (*oper == '#') { /* Immediate */
		s = oper + 1; /* The value starts here. */
		if (*s == '~')
			s++; /* Skip over unary NOT. */
		op->Value = GetValue(s, (op->Loc) + 1);
		op->Mode = Imm;
		op->Hunk = Hunk2;
		op->Defn = DefLine2;
		op->Single = SingleFlag;
		if (*(oper + 1) == '~') { /* Unary NOT of entire value */
			if (Hunk2 != ABSHUNK) {
				Error(op->Loc + 2, RelErr);
				op->Hunk = ABSHUNK; /* Must be absolute! */
			}
			op->Value = ~(op->Value); /* Flip all bits. */
			if (Size == Byte)
				op->Value &= 0xFFL; /* Trim to 8 bits. */
			else if (Size == Word)
				op->Value &= 0xFFFFL; /* Trim to 16 bits. */
		}
		return;
	}

	i = IsRegister(oper, opend - oper + 1);
	if (i >= 0) {
		op->Mode = (i & 8) ? ARDir : DReg; /* Register type */
		op->Rn = i & 7; /* Register number */
		return;
	} else if (i == -2) {
		op->Mode = MultiM; /* Equated register list */
		op->Value = Sym->Val;
		return;
	} else if ((*oper == '(') && (*opend == ')')) {
		i = IsRegister(oper + 1, opend - oper - 1);
		if (i >= 8 && i <= 15) {
			op->Mode = ARInd; /* Address Register indirect */
			op->Rn = i - 8;
			return;
		} else if (i != -1) {
			Error(op->Loc, AddrErr); /* Data register is invalid! */
			return;
		} /* else may be parenthesized expression */
	} else if ((*oper == '(') /* Post-increment */
	&& (*opend == '+') && (*(opend - 1) == ')')) {
		op->Mode = ARPost;
		op->Rn = GetAReg(oper + 1, opend - oper - 2, op->Loc + 1);
		return;
	} else if ((*oper == '-') /* Pre-decrement */
	&& (*opend == ')') && (*(oper + 1) == '(')) {
		i = IsRegister(oper + 2, opend - oper - 2);
		if (i >= 8 && i <= 15) {
			op->Mode = ARPre;
			op->Rn = i - 8;
			return;
		} else if (i > 0) {
			Error(op->Loc, AddrErr); /* Data register is invalid! */
			return;
		} /* else parenthesized expression with leading minus? */
	} else if (strcmp(UCoper, "SR") == 0) {
		op->Mode = SR; /* Status Register */
		return;
	} else if (strcmp(UCoper, "CCR") == 0) {
		op->Mode = CCR; /* Condition Code Register */
		return;
	} else if (strcmp(UCoper, "USP") == 0) {
		op->Mode = USP; /* User Stack Pointer */
		return;
	}

	/* Try to split off displacement (if present).
	 We'll assume we have a register expression if the operand
	 ends with a parenthesized expression not preceded by an
	 operator.  I know this code is a real kludge, but that's
	 the result of the bloody syntax.  Thanks, Motorola.	*/

	s = opend; /* Last character */
	if ((i = (*s == ')'))) /* Trailing parenthesis? */
		while (*(--s) != '(') /* Find left parenthesis. */
			if (s <= oper)
				break;
	if (s <= oper) /* Must not be at beginning. */
		i = FALSE;
	if (i) {
		if (s == (oper + 1)) {
			if (*oper == '-')
				i = FALSE; /* Leading minus sign */
		} else {
			t = s - 1;
			if (*t == '*') { /* Location counter? */
				t--;
				if (!IsOperator(t) || (*t == ')'))
					i = FALSE; /* No, it's multiplication. */
			} else if (IsOperator(t) && (*t != ')')) {
				i = FALSE; /* Preceded by an operator */
			}
		}
	}

	if (i) { /* Looks like a displacement mode */
		*s = '\0';
		op->Value = GetValue(oper, op->Loc); /* Displacement */
		op->Hunk = Hunk2; /* Hunk number */
		op->Defn = DefLine2; /* Line where defined */
		*s++ = '('; /* Restore parenthesis. */

		rloc = op->Loc + s - oper; /* The register starts here. */
		s = GetField(s, tempop); /* Get address register. */
		if (*s == '\0') /* If there's no index register, */
			tempop[strlen(tempop) - 1] = '\0'; /* chop off parenthesis. */

		if ((tempop[2] == '\0') && ((tempop[0] & (~ (1<<5))) == 'P')
				&& ((tempop[1] & (~ (1<<5))) == 'C')) {
			op->Mode = PCDisp; /* Program Counter */
			if (op->Hunk == CurrHunk) {
				op->Value -= (AddrCnt + pcconv); /* Adjust displacement. */
				op->Hunk = ABSHUNK;
			}
		} else {
			if ((op->Value == 0) /* If displacement is zero   */
			&& (op->Hunk == ABSHUNK) /*  and is absolute          */
			&& (op->Defn < LineCount) /*  and is already defined   */
			&& !(OpM68R IN AdrModeA) /*  and isn't for a MOVEP    */
			&& !NoOpt) /*  and we can optimize      */
				op->Mode = ARInd; /*  forget the displacement. */
			else
				op->Mode = ARDisp; /* Address reg. w/displacement */
			op->Rn = GetAReg(tempop, strlen(tempop), rloc);
		}
		if (*s != '\0') { /* Index register is present. */
			if (op->Mode == PCDisp)
				op->Mode = PCDisX; /* Program Counter indexed */
			else
				op->Mode = ARDisX; /* Address Register indexed */
			if (*s != ',')
				Error(op->Loc, AddrErr); /* Bad separator */
			s++; /* Skip separator. */
			rloc = op->Loc + s - oper; /* Start of index */
			s = GetField(s, tempop); /* Get index register. */
			t = tempop + strlen(tempop);
			if (*s == '\0')
				*(--t) = '\0'; /* Chop parenthesis. */
			else
				Error(rloc, AddrErr); /* It better be there. */

			t -= 2;
			if ((t < tempop) || (*t != '.')) {
				op->Xsize = Word; /* Size defaults to 16 bits. */
				t += 3;
			} else {
				*t++ = '\0'; /* Chop off size code. */
				//switch (toupper(*t)) {
				switch (*t & (~ (1<<5))) {
				case 'W': /* Word */
					op->Xsize = Word;
					break;
				case 'L': /* Long */
					op->Xsize = Long;
					break;
				default:
					Error(op->Loc + s - 1 - oper, SizeErr); /* Invalid size */
					op->Xsize = Word; /* Make it word for now. */
				}
			}
			i = IsRegister(tempop, t - tempop - 1); /* Get register. */
			op->Xn = i & 7; /* Index register number */
			if ((i >= 0) && (i <= 7))
				op->X = Dreg; /* Data Register */
			else if ((i >= 8) && (i <= 15))
				op->X = Areg; /* Address Register */
			else
				Error(rloc, AddrErr); /* Invalid register */
		}

		if ((op->Hunk >= 0) && (op->Hunk != ABSHUNK))
			Error(op->Loc, RelErr); /*  Relocatable displacement */
		return;
	}

	if ((i = GetMultReg(oper, op->Loc)) != 0) {
		op->Value = (long) i;
		op->Mode = MultiM; /* Register list for MOVEM */
		return;
	}

	if ((*oper == '(') /* Operands of the form (xxxx).W or (xxxx).L */
	&& (*(opend - 2) == ')') && (*(opend - 1) == '.')
			&& (((*opend & (~ (1<<5))) == 'W') || ((*opend & (~ (1<<5))) == 'L'))) {
		*(opend - 1) = '\0'; /* Temporarily cut off length specifier. */
		op->Value = GetValue(oper, op->Loc); /* Get operand value. */
		op->Hunk = Hunk2;
		op->Defn = DefLine2;
		op->Single = SingleFlag;
		if ((*opend & (~ (1<<5))) == 'W')
			op->Mode = AbsW; /* Absolute word */
		else
			op->Mode = AbsL; /* Absolute long */
		*(opend - 1) = '.'; /* Restore original operand. */
		return;
	}

	op->Value = GetValue(oper, op->Loc); /* Plain old expression */
	op->Hunk = Hunk2;
	op->Defn = DefLine2;
	op->Single = SingleFlag;
	op->Mode = AbsL; /* Assume absolute long addressing. */

	if (NoOpt)
		return; /* Do no optimizing. */

	if (DefLine2 < LineCount) { /* Backward reference */

		if (Hunk2 < 0) {
			return; /* External - leave as absolute long. */

		} else if (Hunk2 == CurrHunk) { /* Reference to current hunk */
			if (pcconv) {
				templong = op->Value - (AddrCnt + pcconv); /* PC disp. */
				if ((templong >= -32768) && (templong <= 32767)) {
					op->Mode = PCDisp; /* Convert to PC relative mode. */
					op->Value = templong; /* Adjust displacement. */
					op->Hunk = ABSHUNK;
				}
			}

		} else if (Hunk2 == ABSHUNK) { /* Absolute value */
			if ((op->Value >= -32768) && (op->Value <= 32767))
				op->Mode = AbsW; /* Absolute word */

		} else if ((SmallData != -1) && (op->Value >= 0)
				&& (op->Value <= 65535L)) {
			op->Mode = ARDisp; /* Make it a data reference     */
			op->Rn = SmallData; /*  through specified register. */
			op->Value -= DataOffset; /* Adjust displacement. */
			op->Hunk = ABSHUNK;
		}
		return; /* Could default to absolute long. */

	} else if (SmallData == -1) { /* Fwd. reference - if not small data, */
		return; /*  leave as absolute long addressing. */

	} else if (Brnch IN AdrModeA) {
		return; /* Branches are handled elsewhere. */

	} else if (!Pass2) { /* Forward reference, pass 1 */
		op->Mode = ARDisp; /* Assume displacement       */
		op->Rn = SmallData; /*  from specified register. */
		op->Hunk = ABSHUNK;
		return;

	} else { /* On pass 2 we know what it is. */

		if (Hunk2 < 0) {
			Error(op->Loc, FwdRef); /* External - must be 32 bits. */
			op->Mode = AbsW; /* Force absolute word anyway. */

		} else if (Hunk2 == CurrHunk) { /* It's in the current hunk. */
			op->Mode = PCDisp; /* Convert to PC relative mode. */
			op->Value -= AddrCnt + pcconv; /* Adjust displacement. */
			op->Hunk = ABSHUNK;
			if (!pcconv || (op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */

		} else if (Hunk2 == ABSHUNK) { /* It's absolute. */
			op->Mode = AbsW; /* It has to fit in a word. */
			if ((op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */

		} else {
			op->Mode = ARDisp; /* Assume data reference        */
			op->Rn = SmallData; /*  through specified register. */
			op->Value -= DataOffset; /* Adjust displacement. */
			if ((op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */
		}
	}
}